

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.hpp
# Opt level: O3

uint32_t rest_rpc::MD5::MD5CE::GetPaddedMessageWord(char *data,uint32_t n,uint32_t m,uint32_t i)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  if (i < n) {
    uVar3 = (uint)(byte)data[i];
  }
  else {
    uVar3 = 0x80;
    if (i != n) {
      if (i < m - 8) {
        uVar3 = 0;
      }
      else {
        uVar3 = n * 8 >> (((char)i - (char)(m - 8)) * '\b' & 0x3fU);
      }
    }
  }
  uVar1 = i + 1;
  if (uVar1 < n) {
    uVar4 = (uint)(byte)data[uVar1];
  }
  else {
    uVar4 = 0x80;
    if (uVar1 != n) {
      if (uVar1 < m - 8) {
        uVar4 = 0;
      }
      else {
        uVar4 = n * 8 >> (((char)uVar1 - (char)(m - 8)) * '\b' & 0x3fU);
      }
    }
  }
  uVar1 = i + 2;
  if (uVar1 < n) {
    uVar5 = (uint)(byte)data[uVar1];
  }
  else {
    uVar5 = 0x80;
    if (uVar1 != n) {
      if (uVar1 < m - 8) {
        uVar5 = 0;
      }
      else {
        uVar5 = n * 8 >> (((char)uVar1 - (char)(m - 8)) * '\b' & 0x3fU);
      }
    }
  }
  uVar1 = i + 3;
  if (uVar1 < n) {
    uVar2 = (uint)(byte)data[uVar1];
  }
  else {
    uVar2 = 0x80;
    if (uVar1 != n) {
      if (uVar1 < m - 8) {
        uVar2 = 0;
      }
      else {
        uVar2 = (n << 3) >> (((char)uVar1 - (char)(m - 8)) * '\b' & 0x3fU);
      }
    }
  }
  return uVar2 << 0x18 | (uVar5 & 0xff) << 0x10 | uVar3 & 0xff | (uVar4 & 0xff) << 8;
}

Assistant:

static uint32_t GetPaddedMessageWord(const char *data, const uint32_t n,
                                       const uint32_t m, const uint32_t i) {
    //    DCHECK_EQ(i % 4, 0u);
    //    DCHECK_LT(i, m);
    //    DCHECK_LT(n, m);
    //    DCHECK_EQ(m % 64, 0u);
    return static_cast<uint32_t>(GetPaddedMessageByte(data, n, m, i)) |
           static_cast<uint32_t>((GetPaddedMessageByte(data, n, m, i + 1))
                                 << 8) |
           static_cast<uint32_t>((GetPaddedMessageByte(data, n, m, i + 2))
                                 << 16) |
           static_cast<uint32_t>((GetPaddedMessageByte(data, n, m, i + 3))
                                 << 24);
  }